

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

MDNode * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::MDNode,LLVMBC::Module*&,std::vector<LLVMBC::MDOperand*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand*>>>
          (LLVMContext *this,Module **u,
          vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *u_1)

{
  Module *module;
  MDNode *this_00;
  _Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> local_38;
  
  this_00 = (MDNode *)allocate(this,0x30,8);
  if (this_00 != (MDNode *)0x0) {
    module = *u;
    local_38._M_impl.super__Vector_impl_data._M_start =
         (u_1->
         super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_38._M_impl.super__Vector_impl_data._M_finish =
         (u_1->
         super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
         (u_1->
         super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (u_1->
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (u_1->
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (u_1->
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MDNode::MDNode(this_00,module,(Vector<MDOperand_*> *)&local_38);
    std::_Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::
    ~_Vector_base(&local_38);
    append_typed_destructor<LLVMBC::MDNode>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}